

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_grouping.cpp
# Opt level: O3

Grouper icu_63::number::impl::Grouper::forStrategy(UGroupingStrategy grouping)

{
  ulong uVar1;
  Grouper GVar2;
  
  uVar1 = 0xfffd;
  if (grouping < UNUM_GROUPING_COUNT) {
    uVar1 = (ulong)grouping;
    uVar1 = *(ulong *)(&DAT_00334410 + uVar1 * 8) | *(ulong *)(&DAT_003343e8 + uVar1 * 8) |
            *(ulong *)(&DAT_00334438 + uVar1 * 8);
  }
  GVar2.fStrategy = grouping;
  GVar2.fGrouping1 = (short)uVar1;
  GVar2.fGrouping2 = (short)(uVar1 >> 0x10);
  GVar2.fMinGrouping = (short)(uVar1 >> 0x20);
  GVar2._6_2_ = (short)(uVar1 >> 0x30);
  return GVar2;
}

Assistant:

Grouper Grouper::forStrategy(UGroupingStrategy grouping) {
    switch (grouping) {
    case UNUM_GROUPING_OFF:
        return {-1, -1, -2, grouping};
    case UNUM_GROUPING_AUTO:
        return {-2, -2, -2, grouping};
    case UNUM_GROUPING_MIN2:
        return {-2, -2, -3, grouping};
    case UNUM_GROUPING_ON_ALIGNED:
        return {-4, -4, 1, grouping};
    case UNUM_GROUPING_THOUSANDS:
        return {3, 3, 1, grouping};
    default:
        U_ASSERT(FALSE);
        return {}; // return a value: silence compiler warning
    }
}